

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void SanitizeFormatString(char *fmt,char *fmt_out,size_t fmt_out_size)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  
  pbVar1 = (byte *)ImParseFormatFindEnd(fmt);
  while (pbVar3 = (byte *)fmt, pbVar3 < pbVar1) {
    uVar2 = *pbVar3 - 0x24;
    if ((0x3b < uVar2) ||
       (fmt = (char *)(pbVar3 + 1), (0x800000000000009U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      *fmt_out = *pbVar3;
      fmt_out = (char *)((byte *)fmt_out + 1);
      fmt = (char *)(pbVar3 + 1);
    }
  }
  *fmt_out = 0;
  return;
}

Assistant:

static void SanitizeFormatString(const char* fmt, char* fmt_out, size_t fmt_out_size)
{
    IM_UNUSED(fmt_out_size);
    const char* fmt_end = ImParseFormatFindEnd(fmt);
    IM_ASSERT((size_t)(fmt_end - fmt + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    while (fmt < fmt_end)
    {
        char c = *(fmt++);
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
}